

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smyblas2.c
# Opt level: O0

void smatvec(int ldm,int nrow,int ncol,float *M,float *vec,float *Mxvec)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  int local_a0;
  int local_9c;
  int k;
  int firstcol;
  float *Mki7;
  float *Mki6;
  float *Mki5;
  float *Mki4;
  float *Mki3;
  float *Mki2;
  float *Mki1;
  float *Mki0;
  float *M0;
  float vi7;
  float vi6;
  float vi5;
  float vi4;
  float vi3;
  float vi2;
  float vi1;
  float vi0;
  float *Mxvec_local;
  float *vec_local;
  float *M_local;
  int ncol_local;
  int nrow_local;
  int ldm_local;
  
  local_9c = 0;
  Mki0 = M;
  while (local_9c < ncol + -7) {
    Mki1 = Mki0;
    Mki2 = Mki0 + ldm;
    Mki3 = Mki2 + ldm;
    Mki4 = Mki3 + ldm;
    Mki5 = Mki4 + ldm;
    Mki6 = Mki5 + ldm;
    fVar1 = vec[local_9c];
    fVar2 = vec[local_9c + 1];
    fVar3 = vec[local_9c + 2];
    fVar4 = vec[local_9c + 3];
    fVar5 = vec[local_9c + 4];
    fVar6 = vec[local_9c + 5];
    iVar9 = local_9c + 7;
    fVar7 = vec[local_9c + 6];
    local_9c = local_9c + 8;
    fVar8 = vec[iVar9];
    _k = Mki6 + ldm + ldm;
    Mki7 = Mki6 + ldm;
    for (local_a0 = 0; local_a0 < nrow; local_a0 = local_a0 + 1) {
      Mxvec[local_a0] =
           fVar8 * *_k +
           fVar7 * *Mki7 +
           fVar6 * *Mki6 +
           fVar5 * *Mki5 + fVar4 * *Mki4 + fVar3 * *Mki3 + fVar1 * *Mki1 + fVar2 * *Mki2 +
           Mxvec[local_a0];
      _k = _k + 1;
      Mki7 = Mki7 + 1;
      Mki6 = Mki6 + 1;
      Mki5 = Mki5 + 1;
      Mki4 = Mki4 + 1;
      Mki3 = Mki3 + 1;
      Mki2 = Mki2 + 1;
      Mki1 = Mki1 + 1;
    }
    Mki0 = Mki0 + (ldm << 3);
  }
  while (local_9c < ncol + -3) {
    Mki1 = Mki0;
    Mki2 = Mki0 + ldm;
    fVar1 = vec[local_9c];
    fVar2 = vec[local_9c + 1];
    iVar9 = local_9c + 3;
    fVar3 = vec[local_9c + 2];
    local_9c = local_9c + 4;
    fVar4 = vec[iVar9];
    Mki4 = Mki2 + ldm + ldm;
    Mki3 = Mki2 + ldm;
    for (local_a0 = 0; local_a0 < nrow; local_a0 = local_a0 + 1) {
      Mxvec[local_a0] =
           fVar4 * *Mki4 + fVar3 * *Mki3 + fVar1 * *Mki1 + fVar2 * *Mki2 + Mxvec[local_a0];
      Mki4 = Mki4 + 1;
      Mki3 = Mki3 + 1;
      Mki2 = Mki2 + 1;
      Mki1 = Mki1 + 1;
    }
    Mki0 = Mki0 + (ldm << 2);
  }
  while (local_9c < ncol) {
    Mki1 = Mki0;
    fVar1 = vec[local_9c];
    for (local_a0 = 0; local_a0 < nrow; local_a0 = local_a0 + 1) {
      Mxvec[local_a0] = fVar1 * *Mki1 + Mxvec[local_a0];
      Mki1 = Mki1 + 1;
    }
    Mki0 = Mki0 + ldm;
    local_9c = local_9c + 1;
  }
  return;
}

Assistant:

void smatvec (int ldm, int nrow, int ncol, float *M, float *vec, float *Mxvec)
{
    float vi0, vi1, vi2, vi3, vi4, vi5, vi6, vi7;
    float *M0;
    register float *Mki0, *Mki1, *Mki2, *Mki3, *Mki4, *Mki5, *Mki6, *Mki7;
    register int firstcol = 0;
    int k;

    M0 = &M[0];
    while ( firstcol < ncol - 7 ) {	/* Do 8 columns */

	Mki0 = M0;
	Mki1 = Mki0 + ldm;
        Mki2 = Mki1 + ldm;
        Mki3 = Mki2 + ldm;
	Mki4 = Mki3 + ldm;
	Mki5 = Mki4 + ldm;
	Mki6 = Mki5 + ldm;
	Mki7 = Mki6 + ldm;

	vi0 = vec[firstcol++];
	vi1 = vec[firstcol++];
	vi2 = vec[firstcol++];
	vi3 = vec[firstcol++];	
	vi4 = vec[firstcol++];
	vi5 = vec[firstcol++];
	vi6 = vec[firstcol++];
	vi7 = vec[firstcol++];	

	for (k = 0; k < nrow; k++) 
	    Mxvec[k] += vi0 * *Mki0++ + vi1 * *Mki1++
		      + vi2 * *Mki2++ + vi3 * *Mki3++ 
		      + vi4 * *Mki4++ + vi5 * *Mki5++
		      + vi6 * *Mki6++ + vi7 * *Mki7++;

	M0 += 8 * ldm;
    }

    while ( firstcol < ncol - 3 ) {	/* Do 4 columns */

	Mki0 = M0;
	Mki1 = Mki0 + ldm;
	Mki2 = Mki1 + ldm;
	Mki3 = Mki2 + ldm;

	vi0 = vec[firstcol++];
	vi1 = vec[firstcol++];
	vi2 = vec[firstcol++];
	vi3 = vec[firstcol++];	
	for (k = 0; k < nrow; k++) 
	    Mxvec[k] += vi0 * *Mki0++ + vi1 * *Mki1++
		      + vi2 * *Mki2++ + vi3 * *Mki3++ ;

	M0 += 4 * ldm;
    }

    while ( firstcol < ncol ) {		/* Do 1 column */

 	Mki0 = M0;
	vi0 = vec[firstcol++];
	for (k = 0; k < nrow; k++)
	    Mxvec[k] += vi0 * *Mki0++;

	M0 += ldm;
    }
	
}